

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O1

Point3f __thiscall
pbrt::AnimatedTransform::operator()(AnimatedTransform *this,Point3f *p,Float time)

{
  float fVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Point3f PVar16;
  Transform t;
  Transform local_90;
  
  if ((this->actuallyAnimated != true) || (time <= this->startTime)) {
    fVar10 = (p->super_Tuple3<pbrt::Point3,_float>).y;
    auVar13 = vinsertps_avx(*(undefined1 (*) [16])((this->startTransform).m.m[0] + 1),
                            ZEXT416((uint)(this->startTransform).m.m[1][1]),0x10);
    auVar8._0_4_ = fVar10 * auVar13._0_4_;
    auVar8._4_4_ = fVar10 * auVar13._4_4_;
    auVar8._8_4_ = fVar10 * auVar13._8_4_;
    auVar8._12_4_ = fVar10 * auVar13._12_4_;
    auVar13 = vinsertps_avx((undefined1  [16])(this->startTransform).m.m[0],
                            ZEXT416((uint)(this->startTransform).m.m[1][0]),0x10);
    fVar5 = (p->super_Tuple3<pbrt::Point3,_float>).x;
    auVar14._4_4_ = fVar5;
    auVar14._0_4_ = fVar5;
    auVar14._8_4_ = fVar5;
    auVar14._12_4_ = fVar5;
    auVar8 = vfmadd213ps_fma(auVar13,auVar14,auVar8);
    auVar13 = vinsertps_avx(*(undefined1 (*) [16])((this->startTransform).m.m[0] + 2),
                            ZEXT416((uint)(this->startTransform).m.m[1][2]),0x10);
    fVar5 = (p->super_Tuple3<pbrt::Point3,_float>).z;
    auVar11._4_4_ = fVar5;
    auVar11._0_4_ = fVar5;
    auVar11._8_4_ = fVar5;
    auVar11._12_4_ = fVar5;
    auVar8 = vfmadd213ps_fma(auVar13,auVar11,auVar8);
    auVar13 = vinsertps_avx(*(undefined1 (*) [16])((this->startTransform).m.m[0] + 3),
                            ZEXT416((uint)(this->startTransform).m.m[1][3]),0x10);
    auVar7._0_4_ = auVar13._0_4_ + auVar8._0_4_;
    auVar7._4_4_ = auVar13._4_4_ + auVar8._4_4_;
    auVar7._8_4_ = auVar13._8_4_ + auVar8._8_4_;
    auVar7._12_4_ = auVar13._12_4_ + auVar8._12_4_;
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * (this->startTransform).m.m[2][1])),auVar14,
                              ZEXT416((uint)(this->startTransform).m.m[2][0]));
    auVar13 = vfmadd231ss_fma(auVar13,auVar11,ZEXT416((uint)(this->startTransform).m.m[2][2]));
    fVar5 = auVar13._0_4_ + (this->startTransform).m.m[2][3];
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * (this->startTransform).m.m[3][1])),auVar14,
                              ZEXT416((uint)(this->startTransform).m.m[3][0]));
    auVar13 = vfmadd231ss_fma(auVar13,auVar11,ZEXT416((uint)(this->startTransform).m.m[3][2]));
    fVar10 = auVar13._0_4_ + (this->startTransform).m.m[3][3];
  }
  else {
    if (time < this->endTime) {
      Interpolate(&local_90,this,time);
      fVar10 = (p->super_Tuple3<pbrt::Point3,_float>).x;
      fVar5 = (p->super_Tuple3<pbrt::Point3,_float>).y;
      fVar1 = (p->super_Tuple3<pbrt::Point3,_float>).z;
      auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * local_90.m.m[0][1])),ZEXT416((uint)fVar10),
                                ZEXT416((uint)local_90.m.m[0][0]));
      auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)fVar1),ZEXT416((uint)local_90.m.m[0][2]));
      fVar3 = auVar13._0_4_ + local_90.m.m[0][3];
      auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * local_90.m.m[1][1])),ZEXT416((uint)fVar10),
                                ZEXT416((uint)local_90.m.m[1][0]));
      auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)fVar1),ZEXT416((uint)local_90.m.m[1][2]));
      fVar4 = auVar13._0_4_ + local_90.m.m[1][3];
      auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * local_90.m.m[2][1])),ZEXT416((uint)fVar10),
                                ZEXT416((uint)local_90.m.m[2][0]));
      auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)fVar1),ZEXT416((uint)local_90.m.m[2][2]));
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * local_90.m.m[3][1])),ZEXT416((uint)fVar10),
                               ZEXT416((uint)local_90.m.m[3][0]));
      auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar1),ZEXT416((uint)local_90.m.m[3][2]));
      fVar10 = auVar8._0_4_ + local_90.m.m[3][3];
      bVar2 = fVar10 == 1.0;
      fVar5 = auVar13._0_4_ + local_90.m.m[2][3];
      fVar5 = (float)((uint)bVar2 * (int)fVar5 + (uint)!bVar2 * (int)(fVar5 / fVar10));
      auVar13 = vinsertps_avx(ZEXT416((uint)bVar2 * (int)fVar3 +
                                      (uint)!bVar2 * (int)(fVar3 / fVar10)),
                              ZEXT416((uint)bVar2 * (int)fVar4 +
                                      (uint)!bVar2 * (int)(fVar4 / fVar10)),0x10);
      uVar6 = auVar13._0_8_;
      goto LAB_004d607f;
    }
    fVar10 = (p->super_Tuple3<pbrt::Point3,_float>).y;
    auVar13 = vinsertps_avx(*(undefined1 (*) [16])((this->endTransform).m.m[0] + 1),
                            ZEXT416((uint)(this->endTransform).m.m[1][1]),0x10);
    auVar9._0_4_ = fVar10 * auVar13._0_4_;
    auVar9._4_4_ = fVar10 * auVar13._4_4_;
    auVar9._8_4_ = fVar10 * auVar13._8_4_;
    auVar9._12_4_ = fVar10 * auVar13._12_4_;
    auVar13 = vinsertps_avx((undefined1  [16])(this->endTransform).m.m[0],
                            ZEXT416((uint)(this->endTransform).m.m[1][0]),0x10);
    fVar5 = (p->super_Tuple3<pbrt::Point3,_float>).x;
    auVar15._4_4_ = fVar5;
    auVar15._0_4_ = fVar5;
    auVar15._8_4_ = fVar5;
    auVar15._12_4_ = fVar5;
    auVar8 = vfmadd213ps_fma(auVar13,auVar15,auVar9);
    auVar13 = vinsertps_avx(*(undefined1 (*) [16])((this->endTransform).m.m[0] + 2),
                            ZEXT416((uint)(this->endTransform).m.m[1][2]),0x10);
    fVar5 = (p->super_Tuple3<pbrt::Point3,_float>).z;
    auVar12._4_4_ = fVar5;
    auVar12._0_4_ = fVar5;
    auVar12._8_4_ = fVar5;
    auVar12._12_4_ = fVar5;
    auVar8 = vfmadd213ps_fma(auVar13,auVar12,auVar8);
    auVar13 = vinsertps_avx(*(undefined1 (*) [16])((this->endTransform).m.m[0] + 3),
                            ZEXT416((uint)(this->endTransform).m.m[1][3]),0x10);
    auVar7._0_4_ = auVar13._0_4_ + auVar8._0_4_;
    auVar7._4_4_ = auVar13._4_4_ + auVar8._4_4_;
    auVar7._8_4_ = auVar13._8_4_ + auVar8._8_4_;
    auVar7._12_4_ = auVar13._12_4_ + auVar8._12_4_;
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * (this->endTransform).m.m[2][1])),auVar15,
                              ZEXT416((uint)(this->endTransform).m.m[2][0]));
    auVar13 = vfmadd231ss_fma(auVar13,auVar12,ZEXT416((uint)(this->endTransform).m.m[2][2]));
    fVar5 = auVar13._0_4_ + (this->endTransform).m.m[2][3];
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * (this->endTransform).m.m[3][1])),auVar15,
                              ZEXT416((uint)(this->endTransform).m.m[3][0]));
    auVar13 = vfmadd231ss_fma(auVar13,auVar12,ZEXT416((uint)(this->endTransform).m.m[3][2]));
    fVar10 = auVar13._0_4_ + (this->endTransform).m.m[3][3];
  }
  uVar6 = auVar7._0_8_;
  if ((fVar10 != 1.0) || (NAN(fVar10))) {
    auVar13._4_4_ = fVar10;
    auVar13._0_4_ = fVar10;
    auVar13._8_4_ = fVar10;
    auVar13._12_4_ = fVar10;
    auVar13 = vdivps_avx(auVar7,auVar13);
    uVar6 = auVar13._0_8_;
    fVar5 = fVar5 / fVar10;
  }
LAB_004d607f:
  PVar16.super_Tuple3<pbrt::Point3,_float>.z = fVar5;
  PVar16.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar6;
  PVar16.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar6 >> 0x20);
  return (Point3f)PVar16.super_Tuple3<pbrt::Point3,_float>;
}

Assistant:

Point3f AnimatedTransform::operator()(const Point3f &p, Float time) const {
    if (!actuallyAnimated || time <= startTime)
        return startTransform(p);
    else if (time >= endTime)
        return endTransform(p);
    Transform t = Interpolate(time);
    return t(p);
}